

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::insert(QString *this,qsizetype i,QChar *unicode,qsizetype size)

{
  Data *pDVar1;
  QChar *pQVar2;
  QChar *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  back_insert_iterator<QVarLengthArray<QChar,_256LL>_> local_258;
  QVarLengthArray<QChar,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < size && -1 < i) {
    pDVar1 = (this->d).d;
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      pQVar2 = (QChar *)(this->d).ptr;
      pQVar3 = (QChar *)L"";
      if (pQVar2 != (QChar *)0x0) {
        pQVar3 = pQVar2;
      }
      if ((pQVar3 <= unicode) && (unicode < pQVar3 + (this->d).size)) {
        memset(&local_250,0xaa,0x200);
        local_250.super_QVLABase<QChar>.super_QVLABaseBase.a = 0x100;
        local_250.super_QVLABase<QChar>.super_QVLABaseBase.s = 0;
        local_250.super_QVLABase<QChar>.super_QVLABaseBase.ptr = &local_250;
        if (0x100 < (ulong)size) {
          QVLABase<QChar>::reallocate_impl(&local_250.super_QVLABase<QChar>,0x100,&local_250,0,size)
          ;
        }
        uVar4 = size + 1;
        local_258.container = &local_250;
        do {
          std::back_insert_iterator<QVarLengthArray<QChar,_256LL>_>::operator=(&local_258,unicode);
          unicode = unicode + 1;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
        insert(this,i,(QChar *)local_250.super_QVLABase<QChar>.super_QVLABaseBase.ptr,size);
        if ((QVarLengthArray<QChar,_256LL> *)local_250.super_QVLABase<QChar>.super_QVLABaseBase.ptr
            != &local_250) {
          QtPrivate::sizedFree
                    (local_250.super_QVLABase<QChar>.super_QVLABaseBase.ptr,
                     local_250.super_QVLABase<QChar>.super_QVLABaseBase.a * 2);
        }
        goto LAB_0011f12c;
      }
    }
    local_250.super_QVLAStorage<2UL,_2UL,_256LL>.array._0_8_ = unicode;
    local_250.super_QVLAStorage<2UL,_2UL,_256LL>.array._8_8_ = size;
    insert_helper<QStringView>(this,i,(QStringView *)&local_250);
  }
LAB_0011f12c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString& QString::insert(qsizetype i, const QChar *unicode, qsizetype size)
{
    if (i < 0 || size <= 0)
        return *this;

    // In case when data points into "this"
    if (!d->needsDetach() && QtPrivate::q_points_into_range(unicode, *this)) {
        QVarLengthArray copy(unicode, unicode + size);
        insert(i, copy.data(), size);
    } else {
        insert_helper(*this, i, QStringView(unicode, size));
    }

    return *this;
}